

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::WriteSegmentHeader(Segment *this)

{
  bool bVar1;
  int iVar2;
  int32 iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t uVar5;
  char *doc_type_00;
  char *doc_type;
  Segment *this_local;
  
  UpdateDocTypeVersion(this);
  bVar1 = DocTypeIsWebm(this);
  doc_type_00 = "matroska";
  if (bVar1) {
    doc_type_00 = "webm";
  }
  bVar1 = WriteEbmlHeader(this->writer_header_,(ulong)this->doc_type_version_,doc_type_00);
  if (bVar1) {
    this->doc_type_version_written_ = this->doc_type_version_;
    iVar2 = (*this->writer_header_->_vptr_IMkvWriter[1])();
    this->ebml_header_size_ = iVar2;
    iVar3 = WriteID(this->writer_header_,0x18538067);
    if (iVar3 == 0) {
      iVar2 = (*this->writer_header_->_vptr_IMkvWriter[1])();
      this->size_position_ = CONCAT44(extraout_var,iVar2);
      iVar3 = SerializeInt(this->writer_header_,0x1ffffffffffffff,8);
      if (iVar3 == 0) {
        iVar2 = (*this->writer_header_->_vptr_IMkvWriter[1])();
        this->payload_pos_ = CONCAT44(extraout_var_00,iVar2);
        if ((this->mode_ == kFile) &&
           (uVar4 = (*this->writer_header_->_vptr_IMkvWriter[3])(), (uVar4 & 1) != 0)) {
          SegmentInfo::set_duration(&this->segment_info_,1.0);
          bVar1 = SeekHead::Write(&this->seek_head_,this->writer_header_);
          if (!bVar1) {
            return false;
          }
        }
        uVar5 = MaxOffset(this);
        bVar1 = SeekHead::AddSeekEntry(&this->seek_head_,0x1549a966,uVar5);
        if (bVar1) {
          bVar1 = SegmentInfo::Write(&this->segment_info_,this->writer_header_);
          if (bVar1) {
            uVar5 = MaxOffset(this);
            bVar1 = SeekHead::AddSeekEntry(&this->seek_head_,0x1654ae6b,uVar5);
            if (bVar1) {
              bVar1 = Tracks::Write(&this->tracks_,this->writer_header_);
              if (bVar1) {
                iVar2 = Chapters::Count(&this->chapters_);
                if (0 < iVar2) {
                  uVar5 = MaxOffset(this);
                  bVar1 = SeekHead::AddSeekEntry(&this->seek_head_,0x1043a770,uVar5);
                  if (!bVar1) {
                    return false;
                  }
                  bVar1 = Chapters::Write(&this->chapters_,this->writer_header_);
                  if (!bVar1) {
                    return false;
                  }
                }
                iVar2 = Tags::Count(&this->tags_);
                if (0 < iVar2) {
                  uVar5 = MaxOffset(this);
                  bVar1 = SeekHead::AddSeekEntry(&this->seek_head_,0x1254c367,uVar5);
                  if (!bVar1) {
                    return false;
                  }
                  bVar1 = Tags::Write(&this->tags_,this->writer_header_);
                  if (!bVar1) {
                    return false;
                  }
                }
                if (((this->chunking_ & 1U) != 0) &&
                   ((this->mode_ == kLive ||
                    (uVar4 = (*this->writer_header_->_vptr_IMkvWriter[3])(), (uVar4 & 1) == 0)))) {
                  if (this->chunk_writer_header_ == (MkvWriter *)0x0) {
                    return false;
                  }
                  MkvWriter::Close(this->chunk_writer_header_);
                }
                this->header_written_ = true;
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Segment::WriteSegmentHeader() {
  UpdateDocTypeVersion();

  const char* const doc_type =
      DocTypeIsWebm() ? kDocTypeWebm : kDocTypeMatroska;
  if (!WriteEbmlHeader(writer_header_, doc_type_version_, doc_type))
    return false;
  doc_type_version_written_ = doc_type_version_;
  ebml_header_size_ = static_cast<int32_t>(writer_header_->Position());

  // Write "unknown" (-1) as segment size value. If mode is kFile, Segment
  // will write over duration when the file is finalized.
  if (WriteID(writer_header_, libwebm::kMkvSegment))
    return false;

  // Save for later.
  size_position_ = writer_header_->Position();

  // Write "unknown" (EBML coded -1) as segment size value. We need to write 8
  // bytes because if we are going to overwrite the segment size later we do
  // not know how big our segment will be.
  if (SerializeInt(writer_header_, kEbmlUnknownValue, 8))
    return false;

  payload_pos_ = writer_header_->Position();

  if (mode_ == kFile && writer_header_->Seekable()) {
    // Set the duration > 0.0 so SegmentInfo will write out the duration. When
    // the muxer is done writing we will set the correct duration and have
    // SegmentInfo upadte it.
    segment_info_.set_duration(1.0);

    if (!seek_head_.Write(writer_header_))
      return false;
  }

  if (!seek_head_.AddSeekEntry(libwebm::kMkvInfo, MaxOffset()))
    return false;
  if (!segment_info_.Write(writer_header_))
    return false;

  if (!seek_head_.AddSeekEntry(libwebm::kMkvTracks, MaxOffset()))
    return false;
  if (!tracks_.Write(writer_header_))
    return false;

  if (chapters_.Count() > 0) {
    if (!seek_head_.AddSeekEntry(libwebm::kMkvChapters, MaxOffset()))
      return false;
    if (!chapters_.Write(writer_header_))
      return false;
  }

  if (tags_.Count() > 0) {
    if (!seek_head_.AddSeekEntry(libwebm::kMkvTags, MaxOffset()))
      return false;
    if (!tags_.Write(writer_header_))
      return false;
  }

  if (chunking_ && (mode_ == kLive || !writer_header_->Seekable())) {
    if (!chunk_writer_header_)
      return false;

    chunk_writer_header_->Close();
  }

  header_written_ = true;

  return true;
}